

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O2

void asio::detail::
     executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  long lVar1;
  allocator<void> allocator;
  binder0<std::function<void_()>_> handler;
  ptr p;
  allocator<void> local_49;
  _Any_data local_48;
  long local_38;
  scheduler_operation *local_30;
  ptr local_20;
  
  local_20.a = &local_49;
  local_48._M_unused._M_object = (scheduler_operation *)0x0;
  local_48._8_8_ = (func_type)0x0;
  local_38 = 0;
  local_30 = base[2].next_;
  lVar1 = *(long *)&base[1].task_result_;
  if (lVar1 != 0) {
    local_48._M_unused._M_object = base[1].next_;
    local_48._8_8_ = base[1].func_;
    *(undefined8 *)&base[1].task_result_ = 0;
    base[2].next_ = (scheduler_operation *)0x0;
    local_38 = lVar1;
  }
  local_20.v = base;
  local_20.p = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)base;
  ptr::reset(&local_20);
  if (owner != (void *)0x0) {
    std::function<void_()>::operator()((function<void_()> *)&local_48);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ptr::~ptr(&local_20);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }